

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (action == 1) {
    if (key < 0x100) {
      if (key == 0x51) goto LAB_00106d5e;
      if (key != 0x57) {
        return;
      }
    }
    else {
      if (key == 0x14e) {
LAB_00106d5e:
        set_gamma(window,gamma_value + 0.1);
        return;
      }
      if (key != 0x14d) {
        if (key != 0x100) {
          return;
        }
        glfwSetWindowShouldClose(window,1);
        return;
      }
    }
    if (0.0 < gamma_value + -0.1) {
      set_gamma(window,gamma_value + -0.1);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
        {
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;
        }

        case GLFW_KEY_KP_ADD:
        case GLFW_KEY_Q:
        {
            set_gamma(window, gamma_value + STEP_SIZE);
            break;
        }

        case GLFW_KEY_KP_SUBTRACT:
        case GLFW_KEY_W:
        {
            if (gamma_value - STEP_SIZE > 0.f)
                set_gamma(window, gamma_value - STEP_SIZE);

            break;
        }
    }
}